

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_layout_helper.cc
# Opt level: O0

FieldFamily
google::protobuf::compiler::cpp::MessageLayoutHelper::GetFieldFamily
          (FieldDescriptor *field,Options *options,MessageSCCAnalyzer *scc_analyzer)

{
  bool bVar1;
  CppType CVar2;
  MessageSCCAnalyzer *scc_analyzer_local;
  Options *options_local;
  FieldDescriptor *field_local;
  
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    bVar1 = ShouldSplit(field,options);
    field_local._4_4_ = REPEATED;
    if (bVar1) {
      field_local._4_4_ = OTHER;
    }
  }
  else {
    CVar2 = FieldDescriptor::cpp_type(field);
    if (CVar2 == CPPTYPE_STRING) {
      field_local._4_4_ = STRING;
    }
    else {
      CVar2 = FieldDescriptor::cpp_type(field);
      if (CVar2 == CPPTYPE_MESSAGE) {
        field_local._4_4_ = MESSAGE;
      }
      else {
        bVar1 = CanInitializeByZeroing(field,options,scc_analyzer);
        if (bVar1) {
          field_local._4_4_ = ZERO_INITIALIZABLE;
        }
        else {
          field_local._4_4_ = OTHER;
        }
      }
    }
  }
  return field_local._4_4_;
}

Assistant:

MessageLayoutHelper::FieldFamily MessageLayoutHelper::GetFieldFamily(
    const FieldDescriptor* field, const Options& options,
    MessageSCCAnalyzer* scc_analyzer) {
  if (field->is_repeated()) {
    return ShouldSplit(field, options) ? OTHER : REPEATED;
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
    return STRING;
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    return MESSAGE;
  } else if (CanInitializeByZeroing(field, options, scc_analyzer)) {
    return ZERO_INITIALIZABLE;
  } else {
    return OTHER;
  }
}